

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-and-recv.c
# Opt level: O0

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  int iVar1;
  uint flags_local;
  sockaddr *addr_local;
  uv_buf_t *rcvbuf_local;
  ssize_t nread_local;
  uv_udp_t *handle_local;
  
  if (nread < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
            ,0x3f,"nread > 0");
    abort();
  }
  if (nread == 0) {
    if (addr != (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
              ,0x42,"addr == NULL");
      abort();
    }
  }
  else {
    if (nread != 4) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
              ,0x46,"nread == 4");
      abort();
    }
    if (addr == (sockaddr *)0x0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
              ,0x47,"addr != NULL");
      abort();
    }
    iVar1 = memcmp("EXIT",rcvbuf->base,4);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-try-send.c"
              ,0x49,"memcmp(\"EXIT\", rcvbuf->base, nread) == 0");
      abort();
    }
    uv_close((uv_handle_t *)handle,close_cb);
    uv_close((uv_handle_t *)&client,close_cb);
    sv_recv_cb_called = sv_recv_cb_called + 1;
  }
  return;
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  uv_udp_send_t* req;
  uv_buf_t sndbuf;
  int r;

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards sv_recv_cb_called */
    ASSERT(addr == NULL);
    return;
  }

  CHECK_HANDLE(handle);
  ASSERT(flags == 0);

  ASSERT(addr != NULL);
  ASSERT(nread == 4);
  ASSERT(!memcmp("PING", rcvbuf->base, nread));

  /* FIXME? `uv_udp_recv_stop` does what it says: recv_cb is not called
    * anymore. That's problematic because the read buffer won't be returned
    * either... Not sure I like that but it's consistent with `uv_read_stop`.
    */
  r = uv_udp_recv_stop(handle);
  ASSERT(r == 0);

  req = malloc(sizeof *req);
  ASSERT(req != NULL);

  sndbuf = uv_buf_init("PONG", 4);
  r = uv_udp_send(req, handle, &sndbuf, 1, addr, sv_send_cb);
  ASSERT(r == 0);

  sv_recv_cb_called++;
}